

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O0

int32_t __thiscall
icu_63::OlsonTimeZone::countTransitionRules(OlsonTimeZone *this,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  int local_28;
  int local_24;
  int32_t i;
  int32_t count;
  UErrorCode *status_local;
  OlsonTimeZone *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    checkTransitionRules(this,status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      local_24 = 0;
      if (this->historicRules != (TimeArrayTimeZoneRule **)0x0) {
        for (local_28 = 0; local_28 < this->historicRuleCount; local_28 = local_28 + 1) {
          if (this->historicRules[local_28] != (TimeArrayTimeZoneRule *)0x0) {
            local_24 = local_24 + 1;
          }
        }
      }
      if (this->finalZone != (SimpleTimeZone *)0x0) {
        iVar2 = (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject
                  [9])();
        if ((char)iVar2 == '\0') {
          local_24 = local_24 + 1;
        }
        else {
          local_24 = local_24 + 2;
        }
      }
      this_local._4_4_ = local_24;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
OlsonTimeZone::countTransitionRules(UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return 0;
    }
    checkTransitionRules(status);
    if (U_FAILURE(status)) {
        return 0;
    }

    int32_t count = 0;
    if (historicRules != NULL) {
        // historicRules may contain null entries when original zoneinfo data
        // includes non transition data.
        for (int32_t i = 0; i < historicRuleCount; i++) {
            if (historicRules[i] != NULL) {
                count++;
            }
        }
    }
    if (finalZone != NULL) {
        if (finalZone->useDaylightTime()) {
            count += 2;
        } else {
            count++;
        }
    }
    return count;
}